

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O1

bool __thiscall
re2::Regexp::Walker<bool>::WalkInternal(Walker<bool> *this,Regexp *re,bool top_arg,bool use_copy)

{
  ushort uVar1;
  uint uVar2;
  deque<re2::WalkState<bool>,std::allocator<re2::WalkState<bool>>> *pdVar3;
  undefined8 *puVar4;
  stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
  *psVar5;
  Regexp *pRVar6;
  _Map_pointer ppWVar7;
  WalkState<bool> *pWVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  bool *pbVar13;
  WalkState<bool> *pWVar14;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar15;
  _Elt_pointer pWVar16;
  uint unaff_R12D;
  bool stop;
  char local_1b8;
  uint local_1b4;
  undefined1 local_1b0 [16];
  bool *local_1a0;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0,3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"Walk NULL",9);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  else {
    pdVar3 = (deque<re2::WalkState<bool>,std::allocator<re2::WalkState<bool>>> *)this->stack_;
    local_1b0._8_4_ = -1;
    local_1b0[0xc] = top_arg;
    local_1a0 = (bool *)0x0;
    puVar4 = *(undefined8 **)(pdVar3 + 0x30);
    local_1b0._0_8_ = re;
    if (puVar4 == (undefined8 *)(*(long *)(pdVar3 + 0x40) + -0x18)) {
      std::deque<re2::WalkState<bool>,std::allocator<re2::WalkState<bool>>>::
      _M_push_back_aux<re2::WalkState<bool>>(pdVar3,(WalkState<bool> *)local_1b0);
    }
    else {
      puVar4[2] = 0;
      *puVar4 = re;
      puVar4[1] = CONCAT44(local_1b0._12_4_,0xffffffff);
      *(long *)(pdVar3 + 0x30) = *(long *)(pdVar3 + 0x30) + 0x18;
    }
    local_1b4 = use_copy ^ 1;
    do {
      psVar5 = this->stack_;
      pWVar16 = (psVar5->c).
                super__Deque_base<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar16 ==
          (psVar5->c).
          super__Deque_base<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pWVar16 = (psVar5->c).
                  super__Deque_base<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      pRVar6 = pWVar16[-1].re;
      uVar11 = unaff_R12D;
      if (pWVar16[-1].n == -1) {
        iVar12 = this->max_visits_;
        this->max_visits_ = iVar12 + -1;
        if (iVar12 < 1) {
          this->stopped_early_ = true;
          uVar11 = (*this->_vptr_Walker[5])(this,pRVar6,(ulong)pWVar16[-1].parent_arg);
        }
        else {
          local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
          uVar11 = (*this->_vptr_Walker[2])(this,pRVar6,(ulong)pWVar16[-1].parent_arg,local_1b0);
          pWVar16[-1].pre_arg = SUB41(uVar11,0);
          cVar9 = local_1b0[0];
          if (local_1b0[0] == '\0') {
            pWVar16[-1].n = 0;
            pWVar16[-1].child_args = (bool *)0x0;
            uVar1 = pRVar6->nsub_;
            uVar11 = unaff_R12D;
            if (uVar1 != 0) {
              if (uVar1 == 1) {
                pbVar13 = &pWVar16[-1].child_arg;
              }
              else {
                pbVar13 = (bool *)operator_new__((ulong)uVar1);
              }
              pWVar16[-1].child_args = pbVar13;
            }
          }
          if (cVar9 == '\0') goto LAB_0010e397;
        }
LAB_0010e53d:
        std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>::pop_back
                  (&this->stack_->c);
        psVar5 = this->stack_;
        ppWVar7 = (psVar5->c).
                  super__Deque_base<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
        pWVar14 = (psVar5->c).
                  super__Deque_base<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        pWVar8 = (psVar5->c).
                 super__Deque_base<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_first;
        if (((long)pWVar14 - (long)pWVar8 >> 3) * -0x5555555555555555 +
            (((long)ppWVar7 -
              (long)(psVar5->c).
                    super__Deque_base<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(ppWVar7 == (_Map_pointer)0x0)) * 0x15 ==
            ((long)(psVar5->c).
                   super__Deque_base<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(psVar5->c).
                   super__Deque_base<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * 0x5555555555555555) {
          iVar12 = 1;
          local_1b4 = uVar11;
        }
        else {
          if (pWVar14 == pWVar8) {
            pWVar14 = ppWVar7[-1] + 0x15;
          }
          if (pWVar14[-1].child_args == (bool *)0x0) {
            pWVar14[-1].child_arg = (bool)((byte)uVar11 & 1);
          }
          else {
            pWVar14[-1].child_args[pWVar14[-1].n] = (bool)((byte)uVar11 & 1);
          }
          pWVar14[-1].n = pWVar14[-1].n + 1;
          iVar12 = 0;
        }
      }
      else {
LAB_0010e397:
        uVar1 = pRVar6->nsub_;
        if (uVar1 == 0) {
LAB_0010e4ef:
          uVar11 = (*this->_vptr_Walker[3])
                             (this,pRVar6,(ulong)pWVar16[-1].parent_arg,(ulong)pWVar16[-1].pre_arg,
                              pWVar16[-1].child_args,(ulong)(uint)pWVar16[-1].n);
          if ((1 < pRVar6->nsub_) && (pWVar16[-1].child_args != (bool *)0x0)) {
            operator_delete__(pWVar16[-1].child_args);
          }
          goto LAB_0010e53d;
        }
        if (uVar1 == 1) {
          paVar15 = &pRVar6->field_5;
        }
        else {
          paVar15 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar6->field_5).submany_;
        }
        uVar2 = pWVar16[-1].n;
        iVar12 = 0;
        if ((int)uVar2 < (int)(uint)uVar1) {
          local_1b8 = (char)(use_copy ^ 1);
          if (((int)uVar2 < 1 || local_1b8 != '\0') ||
             ((Regexp *)paVar15[uVar2 - 1].submany_ != (Regexp *)paVar15[uVar2].submany_)) {
            pdVar3 = (deque<re2::WalkState<bool>,std::allocator<re2::WalkState<bool>>> *)
                     this->stack_;
            local_1b0._0_8_ = paVar15[pWVar16[-1].n].submany_;
            local_1b0._8_4_ = -1;
            local_1b0[0xc] = pWVar16[-1].pre_arg;
            local_1a0 = (bool *)0x0;
            puVar4 = *(undefined8 **)(pdVar3 + 0x30);
            if (puVar4 == (undefined8 *)(*(long *)(pdVar3 + 0x40) + -0x18)) {
              std::deque<re2::WalkState<bool>,std::allocator<re2::WalkState<bool>>>::
              _M_push_back_aux<re2::WalkState<bool>>(pdVar3,(WalkState<bool> *)local_1b0);
            }
            else {
              puVar4[2] = 0;
              *puVar4 = local_1b0._0_8_;
              puVar4[1] = CONCAT44(local_1b0._12_4_,0xffffffff);
              *(long *)(pdVar3 + 0x30) = *(long *)(pdVar3 + 0x30) + 0x18;
            }
          }
          else {
            iVar10 = (*this->_vptr_Walker[4])(this,(ulong)pWVar16[-1].child_args[uVar2 - 1]);
            iVar12 = pWVar16[-1].n;
            pWVar16[-1].child_args[iVar12] = SUB41(iVar10,0);
            pWVar16[-1].n = iVar12 + 1;
          }
          iVar12 = 3;
        }
        if ((int)(uint)uVar1 <= (int)uVar2) goto LAB_0010e4ef;
      }
      unaff_R12D = uVar11;
    } while ((iVar12 == 0) || (iVar12 == 3));
    top_arg = SUB41(local_1b4,0);
  }
  return (bool)(top_arg & 1);
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}